

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_sysprof.c
# Opt level: O2

void default_backtrace_host(_func_void_ptr_int_void_ptr *writer)

{
  int iVar1;
  void *pvVar2;
  undefined8 uVar3;
  long lVar4;
  
  uVar3 = 0x200;
  if (sysprof.opt.mode == '\x01') {
    uVar3 = 7;
  }
  iVar1 = backtrace(default_backtrace_host::backtrace_buf,uVar3);
  lVar4 = 6;
  do {
    if (iVar1 <= lVar4) {
      return;
    }
    pvVar2 = (*writer)((int)lVar4 + -5,default_backtrace_host::backtrace_buf[lVar4]);
    lVar4 = lVar4 + 1;
  } while (pvVar2 != (void *)0x0);
  return;
}

Assistant:

static void default_backtrace_host(void *(writer)(int frame_no, void *addr))
{
  static void *backtrace_buf[SYSPROF_BACKTRACE_FRAME_MAX] = {};

  struct sysprof *sp = &sysprof;
  int max_depth = sp->opt.mode == LUAM_SYSPROF_LEAF
                  ? SYSPROF_HANDLER_STACK_DEPTH + 1
                  : SYSPROF_BACKTRACE_FRAME_MAX;
  const int depth = backtrace(backtrace_buf, max_depth);
  int level;

  lj_assertX(depth <= max_depth, "depth of C stack is too big");
  for (level = SYSPROF_HANDLER_STACK_DEPTH; level < depth; ++level) {
    if (!writer(level - SYSPROF_HANDLER_STACK_DEPTH + 1, backtrace_buf[level]))
      return;
  }
}